

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# childgenerator.cpp
# Opt level: O0

string * __thiscall
ChildGenerator::handleFieldGeneration_abi_cxx11_
          (string *__return_storage_ptr__,ChildGenerator *this,int fieldIndex)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  ChildGenerator *pCVar7;
  int *arg;
  int *arg_00;
  int *arg_01;
  int *arg_02;
  string local_bc0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  string local_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  string local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  string local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  string local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280 [32];
  string local_260 [32];
  undefined1 local_240 [8];
  string elementString;
  undefined1 local_218 [4];
  int i;
  string msgString;
  undefined1 local_1f0 [4];
  int elementIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_60 [8];
  string type;
  string listIndexString;
  int fieldIndex_local;
  ChildGenerator *this_local;
  string *code;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)(type.field_2._M_local_buf + 8));
  getFieldType_abi_cxx11_((string *)local_60,this,fieldIndex);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"single_value");
  if (bVar1) {
    std::operator+(&local_f0,"    ",&this->parentName_);
    std::operator+(&local_d0,&local_f0,".add(");
    getFieldMsg_abi_cxx11_(&local_110,this,fieldIndex);
    std::operator+(&local_b0,&local_d0,&local_110);
    std::operator+(&local_90,&local_b0,");\n\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60,"list");
    if (bVar1) {
      this->listIndex_ = this->listIndex_ + 1;
      boost::lexical_cast<std::__cxx11::string,int>(&local_130,(boost *)&this->listIndex_,arg);
      std::__cxx11::string::operator=
                ((string *)(type.field_2._M_local_buf + 8),(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     "    Bottle& ",&this->parentName_);
      std::operator+(&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     "_");
      std::operator+(&local_1b0,&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type.field_2 + 8));
      std::operator+(&local_190,&local_1b0," = ");
      std::operator+(&local_170,&local_190,&this->parentName_);
      std::operator+(&local_150,&local_170,".addList();\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)local_1f0);
      msgString.field_2._12_4_ = 0;
      getFieldMsg_abi_cxx11_((string *)local_218,this,fieldIndex);
      for (elementString.field_2._12_4_ = 0; uVar2 = (ulong)(int)elementString.field_2._12_4_,
          uVar3 = std::__cxx11::string::size(), uVar2 < uVar3;
          elementString.field_2._12_4_ = elementString.field_2._12_4_ + 1) {
        pcVar4 = (char *)std::__cxx11::string::at((ulong)local_218);
        if ((*pcVar4 == ',') ||
           (lVar5 = (long)(int)elementString.field_2._12_4_, lVar6 = std::__cxx11::string::size(),
           lVar5 == lVar6 + -1)) {
          std::__cxx11::string::string((string *)local_240);
          lVar5 = (long)(int)elementString.field_2._12_4_;
          lVar6 = std::__cxx11::string::size();
          if (lVar5 == lVar6 + -1) {
            std::__cxx11::string::substr((ulong)local_260,(ulong)local_218);
            std::__cxx11::string::operator=((string *)local_240,local_260);
            std::__cxx11::string::~string(local_260);
          }
          else {
            std::__cxx11::string::substr((ulong)local_280,(ulong)local_218);
            std::__cxx11::string::operator=((string *)local_240,local_280);
            std::__cxx11::string::~string(local_280);
          }
          boost::algorithm::erase_all<std::__cxx11::string,char[2]>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                     (char (*) [2])0x13ae75);
          std::operator+(&local_340,"    ",&this->parentName_);
          std::operator+(&local_320,&local_340,"_");
          std::operator+(&local_300,&local_320,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&type.field_2 + 8));
          std::operator+(&local_2e0,&local_300,".add(");
          std::operator+(&local_2c0,&local_2e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_240);
          std::operator+(&local_2a0,&local_2c0,");\n");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_320);
          std::__cxx11::string::~string((string *)&local_340);
          msgString.field_2._12_4_ = elementString.field_2._12_4_ + 1;
          std::__cxx11::string::~string((string *)local_240);
        }
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
      std::__cxx11::string::~string((string *)local_218);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60,"timestamp");
      if (bVar1) {
        this->listIndex_ = this->listIndex_ + 1;
        boost::lexical_cast<std::__cxx11::string,int>(&local_360,(boost *)&this->listIndex_,arg_00);
        std::__cxx11::string::operator=
                  ((string *)(type.field_2._M_local_buf + 8),(string *)&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        if ((this->toRos_ & 1U) == 0) {
          std::operator+(&local_5e0,"    Bottle& ",&this->parentName_);
          std::operator+(&local_5c0,&local_5e0,"_");
          std::operator+(&local_5a0,&local_5c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&type.field_2 + 8));
          std::operator+(&local_580,&local_5a0," = ");
          std::operator+(&local_560,&local_580,&this->parentName_);
          std::operator+(&local_540,&local_560,".addList();\n");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_540);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_560);
          std::__cxx11::string::~string((string *)&local_580);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_5c0);
          std::__cxx11::string::~string((string *)&local_5e0);
          std::operator+(&local_660,"    ",&this->parentName_);
          std::operator+(&local_640,&local_660,"_");
          std::operator+(&local_620,&local_640,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&type.field_2 + 8));
          std::operator+(&local_600,&local_620,".add(counter);\n");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_600);
          std::__cxx11::string::~string((string *)&local_600);
          std::__cxx11::string::~string((string *)&local_620);
          std::__cxx11::string::~string((string *)&local_640);
          std::__cxx11::string::~string((string *)&local_660);
          std::operator+(&local_6e0,"    ",&this->parentName_);
          std::operator+(&local_6c0,&local_6e0,"_");
          std::operator+(&local_6a0,&local_6c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&type.field_2 + 8));
          std::operator+(&local_680,&local_6a0,".add(timestamp);\n");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_680);
          std::__cxx11::string::~string((string *)&local_680);
          std::__cxx11::string::~string((string *)&local_6a0);
          std::__cxx11::string::~string((string *)&local_6c0);
          std::__cxx11::string::~string((string *)&local_6e0);
        }
        else {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    double dummy;\n");
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,"    double frac=modf(timestamp,&dummy);\n");
          std::operator+(&local_420,"    Bottle& ",&this->parentName_);
          std::operator+(&local_400,&local_420,"_");
          std::operator+(&local_3e0,&local_400,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&type.field_2 + 8));
          std::operator+(&local_3c0,&local_3e0," = ");
          std::operator+(&local_3a0,&local_3c0,&this->parentName_);
          std::operator+(&local_380,&local_3a0,".addList();\n");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_380);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_400);
          std::__cxx11::string::~string((string *)&local_420);
          std::operator+(&local_4a0,"    ",&this->parentName_);
          std::operator+(&local_480,&local_4a0,"_");
          std::operator+(&local_460,&local_480,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&type.field_2 + 8));
          std::operator+(&local_440,&local_460,".add((int)timestamp);\n");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_440);
          std::__cxx11::string::~string((string *)&local_440);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_480);
          std::__cxx11::string::~string((string *)&local_4a0);
          std::operator+(&local_520,"    ",&this->parentName_);
          std::operator+(&local_500,&local_520,"_");
          std::operator+(&local_4e0,&local_500,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&type.field_2 + 8));
          std::operator+(&local_4c0,&local_4e0,".add((int)round(frac*pow(10,9)));\n\n");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_4c0);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_500);
          std::__cxx11::string::~string((string *)&local_520);
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60,"counter");
        if (bVar1) {
          std::operator+(&local_720,"    ",&this->parentName_);
          std::operator+(&local_700,&local_720,".add(counter);\n\n");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_700);
          std::__cxx11::string::~string((string *)&local_700);
          std::__cxx11::string::~string((string *)&local_720);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_60,"mux");
          if (bVar1) {
            this->listIndex_ = this->listIndex_ + 1;
            boost::lexical_cast<std::__cxx11::string,int>
                      (&local_740,(boost *)&this->listIndex_,arg_01);
            std::__cxx11::string::operator=
                      ((string *)(type.field_2._M_local_buf + 8),(string *)&local_740);
            std::__cxx11::string::~string((string *)&local_740);
            if ((this->toRos_ & 1U) == 0) {
              getFieldMux_abi_cxx11_(&local_9a0,this,fieldIndex);
              std::operator+(&local_980,"    for(int i = 0; i < ",&local_9a0);
              std::operator+(&local_960,&local_980,".size(); i++) {\n");
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_960);
              std::__cxx11::string::~string((string *)&local_960);
              std::__cxx11::string::~string((string *)&local_980);
              std::__cxx11::string::~string((string *)&local_9a0);
              std::operator+(&local_a60,"      ",&this->parentName_);
              std::operator+(&local_a40,&local_a60,"_");
              std::operator+(&local_a20,&local_a40,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&type.field_2 + 8));
              std::operator+(&local_a00,&local_a20,".add(");
              getFieldMux_abi_cxx11_(&local_a80,this,fieldIndex);
              std::operator+(&local_9e0,&local_a00,&local_a80);
              std::operator+(&local_9c0,&local_9e0,".get(i));\n");
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_9c0);
              std::__cxx11::string::~string((string *)&local_9c0);
              std::__cxx11::string::~string((string *)&local_9e0);
              std::__cxx11::string::~string((string *)&local_a80);
              std::__cxx11::string::~string((string *)&local_a00);
              std::__cxx11::string::~string((string *)&local_a20);
              std::__cxx11::string::~string((string *)&local_a40);
              std::__cxx11::string::~string((string *)&local_a60);
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    }\n\n");
            }
            else {
              std::operator+(&local_800,"    Bottle& ",&this->parentName_);
              std::operator+(&local_7e0,&local_800,"_");
              std::operator+(&local_7c0,&local_7e0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&type.field_2 + 8));
              std::operator+(&local_7a0,&local_7c0," = ");
              std::operator+(&local_780,&local_7a0,&this->parentName_);
              std::operator+(&local_760,&local_780,".addList();\n\n");
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_760);
              std::__cxx11::string::~string((string *)&local_760);
              std::__cxx11::string::~string((string *)&local_780);
              std::__cxx11::string::~string((string *)&local_7a0);
              std::__cxx11::string::~string((string *)&local_7c0);
              std::__cxx11::string::~string((string *)&local_7e0);
              std::__cxx11::string::~string((string *)&local_800);
              getFieldMux_abi_cxx11_(&local_860,this,fieldIndex);
              std::operator+(&local_840,"    for(int i = 0; i < ",&local_860);
              std::operator+(&local_820,&local_840,".size(); i++) {\n");
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_820);
              std::__cxx11::string::~string((string *)&local_820);
              std::__cxx11::string::~string((string *)&local_840);
              std::__cxx11::string::~string((string *)&local_860);
              std::operator+(&local_920,"      ",&this->parentName_);
              std::operator+(&local_900,&local_920,"_");
              std::operator+(&local_8e0,&local_900,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&type.field_2 + 8));
              std::operator+(&local_8c0,&local_8e0,".add(");
              getFieldMux_abi_cxx11_(&local_940,this,fieldIndex);
              std::operator+(&local_8a0,&local_8c0,&local_940);
              std::operator+(&local_880,&local_8a0,".get(i));\n");
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_880);
              std::__cxx11::string::~string((string *)&local_880);
              std::__cxx11::string::~string((string *)&local_8a0);
              std::__cxx11::string::~string((string *)&local_940);
              std::__cxx11::string::~string((string *)&local_8c0);
              std::__cxx11::string::~string((string *)&local_8e0);
              std::__cxx11::string::~string((string *)&local_900);
              std::__cxx11::string::~string((string *)&local_920);
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    }\n\n");
            }
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_60,"msg");
            if (bVar1) {
              this->listIndex_ = this->listIndex_ + 1;
              boost::lexical_cast<std::__cxx11::string,int>
                        (&local_aa0,(boost *)&this->listIndex_,arg_02);
              std::__cxx11::string::operator=
                        ((string *)(type.field_2._M_local_buf + 8),(string *)&local_aa0);
              std::__cxx11::string::~string((string *)&local_aa0);
              std::operator+(&local_b60,"    Bottle& ",&this->parentName_);
              std::operator+(&local_b40,&local_b60,"_");
              std::operator+(&local_b20,&local_b40,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&type.field_2 + 8));
              std::operator+(&local_b00,&local_b20," = ");
              std::operator+(&local_ae0,&local_b00,&this->parentName_);
              std::operator+(&local_ac0,&local_ae0,".addList();\n\n");
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_ac0);
              std::__cxx11::string::~string((string *)&local_ac0);
              std::__cxx11::string::~string((string *)&local_ae0);
              std::__cxx11::string::~string((string *)&local_b00);
              std::__cxx11::string::~string((string *)&local_b20);
              std::__cxx11::string::~string((string *)&local_b40);
              std::__cxx11::string::~string((string *)&local_b60);
              pCVar7 = getFirstChild(this);
              std::operator+(&local_ba0,&this->parentName_,"_");
              std::operator+(&local_b80,&local_ba0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&type.field_2 + 8));
              setParentName(pCVar7,&local_b80);
              std::__cxx11::string::~string((string *)&local_b80);
              std::__cxx11::string::~string((string *)&local_ba0);
              pCVar7 = getFirstChild(this);
              (**(pCVar7->super_YarpCodeGenerator)._vptr_YarpCodeGenerator)(local_bc0);
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_bc0);
              std::__cxx11::string::~string(local_bc0);
              removeFirstChild(this);
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string ChildGenerator::handleFieldGeneration(int fieldIndex) {
  std::string code;

  std::string listIndexString;

  std::string type = getFieldType(fieldIndex);

  if(type == "single_value") {
    code += "    " + parentName_ + ".add(" + getFieldMsg(fieldIndex) + ");\n\n";
  } else if(type == "list") {
      listIndex_++;
      listIndexString = boost::lexical_cast<std::string>(listIndex_);
      code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n";
      int elementIndex = 0;
      std::string msgString = getFieldMsg(fieldIndex);
      for(int i = 0; i < msgString.size(); i++) {
        if(msgString.at(i) == ',' || i == (msgString.size() - 1)) {
          std::string elementString;
          if(i == (msgString.size() - 1))
            elementString = msgString.substr(elementIndex, ((i - elementIndex) + 1));
          else
            elementString = msgString.substr(elementIndex, (i - elementIndex));
          boost::erase_all(elementString, " ");
          code += "    " + parentName_ + "_" + listIndexString + ".add(" + elementString + ");\n";
          elementIndex = i + 1;
        }
      }
      code += "\n";
    } else if(type == "timestamp") {
        listIndex_++;
        listIndexString = boost::lexical_cast<std::string>(listIndex_);
        if (toRos_){
            code += "    double dummy;\n";
            code += "    double frac=modf(timestamp,&dummy);\n";
            code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add((int)timestamp);\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add((int)round(frac*pow(10,9)));\n\n";
        }
        else {
            code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add(counter);\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add(timestamp);\n";
        }
      } else if(type == "counter") {
          code += "    " + parentName_ + ".add(counter);\n\n";
        } else if(type == "mux") {
            listIndex_++;
            listIndexString = boost::lexical_cast<std::string>(listIndex_);
            if (toRos_)
            {
                code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n\n";
                code += "    for(int i = 0; i < " + getFieldMux(fieldIndex) + ".size(); i++) {\n";
                code += "      " + parentName_ + "_" + listIndexString + ".add(" + getFieldMux(fieldIndex) + ".get(i));\n";
                code += "    }\n\n";
            }
            else {
                code += "    for(int i = 0; i < " + getFieldMux(fieldIndex) + ".size(); i++) {\n";
                code += "      " + parentName_ + "_" + listIndexString + ".add(" + getFieldMux(fieldIndex) + ".get(i));\n";
                code += "    }\n\n";
            }

          } else if(type == "msg") {
              listIndex_++;
              listIndexString = boost::lexical_cast<std::string>(listIndex_);
              code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n\n";
              getFirstChild().setParentName(parentName_ + "_" + listIndexString);
              code += getFirstChild().generateCode();
              removeFirstChild();
            }

  return code;
}